

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall OpenMD::EAM::EAM(EAM *this)

{
  allocator<char> *in_RDI;
  MetallicInteraction *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  MetallicInteraction::MetallicInteraction(in_stack_ffffffffffffffb0);
  *(undefined ***)in_RDI = &PTR__EAM_00565a30;
  in_RDI[8] = (allocator<char>)0x0;
  in_RDI[9] = (allocator<char>)0x0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x43f1bd);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x43f1d0);
  std::vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>::vector
            ((vector<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_> *)0x43f1e3);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
            *)0x43f1f6);
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x43f222);
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  Vector3<double>::Vector3((Vector3<double> *)0x43f23e);
  *(undefined4 *)(in_RDI + 0xf8) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffeb);
  *(undefined8 *)(in_RDI + 0xd0) = 0x4074c1053bded360;
  return;
}

Assistant:

EAM::EAM() :
      initialized_(false), haveCutoffRadius_(false), forceField_(NULL),
      electrostatic_(NULL), eamRcut_(0.0), mixMeth_(eamJohnson), name_("EAM") {
    // This prefactor converts charge-charge interactions into kcal /
    // mol assuming distances are measured in angstroms and charges
    // are measured in electrons. Matches the value in
    // Electrostatics.cpp
    pre11_ = 332.0637778;
  }